

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void libevent_global_shutdown(void)

{
  event_disable_debug_mode();
  event_free_globals();
  return;
}

Assistant:

void
libevent_global_shutdown(void)
{
	event_disable_debug_mode();
	event_free_globals();
}